

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O2

void __thiscall wasm::PrintSExpression::visitImportedFunction(PrintSExpression *this,Function *curr)

{
  doIndent(this->o,this->indent);
  this->currFunction = curr;
  if ((this->lastPrintedLocation).super__Optional_base<wasm::Function::DebugLocation,_true,_true>.
      _M_payload.super__Optional_payload_base<wasm::Function::DebugLocation>._M_engaged == true) {
    (this->lastPrintedLocation).super__Optional_base<wasm::Function::DebugLocation,_true,_true>.
    _M_payload.super__Optional_payload_base<wasm::Function::DebugLocation>._M_engaged = false;
  }
  std::operator<<(this->o,'(');
  emitImportHeader(this,&curr->super_Importable);
  handleSignature(this,curr,false);
  std::operator<<(this->o,"))");
  std::operator<<(this->o,this->maybeNewLine);
  return;
}

Assistant:

void PrintSExpression::visitImportedFunction(Function* curr) {
  doIndent(o, indent);
  currFunction = curr;
  lastPrintedLocation = std::nullopt;
  o << '(';
  emitImportHeader(curr);
  handleSignature(curr);
  o << "))";
  o << maybeNewLine;
}